

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

void __thiscall Map::Face(Map *this,Character *from,Direction direction)

{
  Character *other;
  bool bVar1;
  int num;
  _List_node_base *p_Var2;
  PacketBuilder builder;
  PacketBuilder local_60;
  
  from->direction = direction;
  Character::CancelSpell(from);
  PacketBuilder::PacketBuilder(&local_60,PACKET_FACE,PACKET_PLAYER,3);
  num = Character::PlayerID(from);
  PacketBuilder::AddShort(&local_60,num);
  PacketBuilder::AddChar(&local_60,(uint)direction);
  p_Var2 = (this->characters).super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var2 != (_List_node_base *)&this->characters) {
    do {
      other = (Character *)p_Var2[1]._M_next;
      if (other != from) {
        bVar1 = Character::InRange(from,other);
        if (bVar1) {
          Character::Send(other,&local_60);
        }
      }
      p_Var2 = p_Var2->_M_next;
    } while (p_Var2 != (_List_node_base *)&this->characters);
  }
  PacketBuilder::~PacketBuilder(&local_60);
  return;
}

Assistant:

void Map::Face(Character *from, Direction direction)
{
	from->direction = direction;

	from->CancelSpell();

	PacketBuilder builder(PACKET_FACE, PACKET_PLAYER, 3);
	builder.AddShort(from->PlayerID());
	builder.AddChar(direction);

	UTIL_FOREACH(this->characters, character)
	{
		if (character == from || !from->InRange(character))
		{
			continue;
		}

		character->Send(builder);
	}
}